

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation.cpp
# Opt level: O0

void __thiscall QStyleAnimation::updateCurrentTime(QStyleAnimation *this,int time)

{
  int iVar1;
  QObject *pQVar2;
  ulong uVar3;
  int in_ESI;
  long *in_RDI;
  QStyleAnimation *in_stack_ffffffffffffffd8;
  
  iVar1 = (int)in_RDI[4] + 1;
  *(int *)(in_RDI + 4) = iVar1;
  if ((*(int *)((long)in_RDI + 0x1c) <= iVar1) ||
     (iVar1 = (**(code **)(*in_RDI + 0x60))(), iVar1 <= in_ESI)) {
    *(undefined4 *)(in_RDI + 4) = 0;
    pQVar2 = target((QStyleAnimation *)0x4c6377);
    if ((pQVar2 != (QObject *)0x0) && (uVar3 = (**(code **)(*in_RDI + 0x80))(), (uVar3 & 1) != 0)) {
      updateTarget(in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void QStyleAnimation::updateCurrentTime(int time)
{
    if (++_skip >= _fps || time >= duration()) {
        _skip = 0;
        if (target() && isUpdateNeeded())
            updateTarget();
    }
}